

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O3

void dlib::cpu::batch_normalize
               (double eps,resizable_tensor *dest,resizable_tensor *means,resizable_tensor *invstds,
               double averaging_factor,resizable_tensor *running_means,
               resizable_tensor *running_variances,tensor *src,tensor *gamma,tensor *beta)

{
  resizable_tensor *this;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  ulong uVar7;
  undefined4 extraout_var_13;
  ulong uVar8;
  undefined4 extraout_var_14;
  ostream *poVar9;
  fatal_error *pfVar10;
  long lVar11;
  long lVar12;
  float *d;
  long lVar13;
  size_t sVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  tensor *__range2;
  ostringstream dlib_o_out;
  string local_218;
  resizable_tensor *local_1f8;
  resizable_tensor *local_1f0;
  tensor *local_1e8;
  tensor *local_1e0;
  undefined8 *local_1d8;
  float local_1d0;
  undefined1 local_1c8 [24];
  ulong local_1b0;
  string *local_50;
  float local_48;
  undefined8 **local_40;
  string **local_38;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  if ((averaging_factor < 0.0) || (1.0 < averaging_factor)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"\n\nError detected at line ",0x19);
    poVar9 = (ostream *)std::ostream::operator<<(local_1c8,0x2d1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
               ,0xcf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"0 <= averaging_factor && averaging_factor <= 1",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,".\n",2);
    *(uint *)((long)&local_1b0 + (long)*(_func_int **)(local_1c8._0_8_ + -0x18)) =
         *(uint *)((long)&local_1b0 + (long)*(_func_int **)(local_1c8._0_8_ + -0x18)) | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"averaging_factor: ",0x12);
    poVar9 = std::ostream::_M_insert<double>(averaging_factor);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    pfVar10 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar10,EBROKEN_ASSERT,&local_218);
    __cxa_throw(pfVar10,&fatal_error::typeinfo,error::~error);
  }
  if ((averaging_factor != 1.0) || (NAN(averaging_factor))) {
    if (((running_means->super_tensor).m_n != (means->super_tensor).m_n) ||
       ((((running_means->super_tensor).m_k != (means->super_tensor).m_k ||
         ((running_means->super_tensor).m_nr != (means->super_tensor).m_nr)) ||
        ((running_means->super_tensor).m_nc != (means->super_tensor).m_nc)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"\n\nError detected at line ",0x19);
      poVar9 = (ostream *)std::ostream::operator<<(local_1c8,0x2d2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                 ,0xcf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "averaging_factor==1 || have_same_dimensions(running_means,means)",0x40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,".\n",2);
      *(uint *)((long)&local_1b0 + (long)*(_func_int **)(local_1c8._0_8_ + -0x18)) =
           *(uint *)((long)&local_1b0 + (long)*(_func_int **)(local_1c8._0_8_ + -0x18)) | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
      pfVar10 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar10,EBROKEN_ASSERT,&local_218);
      __cxa_throw(pfVar10,&fatal_error::typeinfo,error::~error);
    }
    if ((((running_variances->super_tensor).m_n != (invstds->super_tensor).m_n) ||
        ((running_variances->super_tensor).m_k != (invstds->super_tensor).m_k)) ||
       (((running_variances->super_tensor).m_nr != (invstds->super_tensor).m_nr ||
        ((running_variances->super_tensor).m_nc != (invstds->super_tensor).m_nc)))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"\n\nError detected at line ",0x19);
      poVar9 = (ostream *)std::ostream::operator<<(local_1c8,0x2d3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Error detected in file ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Error detected in function ",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
                 ,0xcf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,".\n\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Failing expression was ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "averaging_factor==1 || have_same_dimensions(running_variances,invstds)",0x46);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,".\n",2);
      *(uint *)((long)&local_1b0 + (long)*(_func_int **)(local_1c8._0_8_ + -0x18)) =
           *(uint *)((long)&local_1b0 + (long)*(_func_int **)(local_1c8._0_8_ + -0x18)) | 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
      pfVar10 = (fatal_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      fatal_error::fatal_error(pfVar10,EBROKEN_ASSERT,&local_218);
      __cxa_throw(pfVar10,&fatal_error::typeinfo,error::~error);
    }
  }
  lVar13 = src->m_n;
  if ((((lVar13 < 2) || (gamma->m_n != 1)) ||
      (((beta->m_n != 1 ||
        ((((lVar3 = gamma->m_nr, lVar3 != beta->m_nr || (lVar3 != src->m_nr)) ||
          (lVar4 = gamma->m_nc, lVar4 != beta->m_nc)) ||
         ((lVar4 != src->m_nc || (lVar18 = gamma->m_k, lVar18 != beta->m_k)))))) || (eps <= 0.0))))
     || (lVar18 != src->m_k)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"\n\nError detected at line ",0x19);
    poVar9 = (ostream *)std::ostream::operator<<(local_1c8,0x2e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Error detected in file ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
               ,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Error detected in function ",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "void dlib::cpu::batch_normalize(const double, resizable_tensor &, resizable_tensor &, resizable_tensor &, const double, resizable_tensor &, resizable_tensor &, const tensor &, const tensor &, const tensor &)"
               ,0xcf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,".\n\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Failing expression was ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,
               "src.num_samples() > 1 && gamma.num_samples() == 1 && beta.num_samples() == 1 && gamma.nr() == beta.nr() && beta.nr() == src.nr() && gamma.nc() == beta.nc() && beta.nc() == src.nc() && gamma.k() == beta.k() && beta.k() == src.k() && eps > 0"
               ,0xef);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,".\n",2);
    *(uint *)((long)&local_1b0 + (long)*(_func_int **)(local_1c8._0_8_ + -0x18)) =
         *(uint *)((long)&local_1b0 + (long)*(_func_int **)(local_1c8._0_8_ + -0x18)) | 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"\ngamma.num_samples(): ",0x16);
    poVar9 = std::ostream::_M_insert<long>((long)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\ngamma.k():  ",0xd);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\ngamma.nr(): ",0xd);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\ngamma.nc(): ",0xd);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nbeta.num_samples(): ",0x15);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nbeta.k():   ",0xd);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nbeta.nr():  ",0xd);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nbeta.nc():  ",0xd);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nsrc.k():   ",0xc);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nsrc.nr():  ",0xc);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\nsrc.nc():  ",0xc);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\neps:  ",7);
    poVar9 = std::ostream::_M_insert<double>(eps);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    pfVar10 = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(pfVar10,EBROKEN_ASSERT,&local_218);
    __cxa_throw(pfVar10,&fatal_error::typeinfo,error::~error);
  }
  local_1e8 = gamma;
  local_1e0 = beta;
  (dest->super_tensor).m_n = lVar13;
  (dest->super_tensor).m_k = lVar18;
  (dest->super_tensor).m_nr = lVar3;
  (dest->super_tensor).m_nc = lVar4;
  sVar14 = lVar4 * lVar18 * lVar3 * lVar13;
  (dest->super_tensor).m_size = sVar14;
  local_1f8 = dest;
  gpu_data::set_size(&dest->data_instance,sVar14);
  lVar13 = src->m_k;
  lVar3 = src->m_nr;
  lVar4 = src->m_nc;
  (means->super_tensor).m_n = 1;
  (means->super_tensor).m_k = lVar13;
  (means->super_tensor).m_nr = lVar3;
  (means->super_tensor).m_nc = lVar4;
  sVar14 = lVar3 * lVar13 * lVar4;
  (means->super_tensor).m_size = sVar14;
  gpu_data::set_size(&means->data_instance,sVar14);
  lVar13 = src->m_k;
  lVar3 = src->m_nr;
  lVar4 = src->m_nc;
  (invstds->super_tensor).m_n = 1;
  (invstds->super_tensor).m_k = lVar13;
  (invstds->super_tensor).m_nr = lVar3;
  (invstds->super_tensor).m_nc = lVar4;
  sVar14 = lVar3 * lVar13 * lVar4;
  (invstds->super_tensor).m_size = sVar14;
  gpu_data::set_size(&invstds->data_instance,sVar14);
  iVar1 = (*(means->super_tensor)._vptr_tensor[4])(means);
  lVar13 = (means->super_tensor).m_size;
  if (lVar13 != 0) {
    memset((void *)CONCAT44(extraout_var,iVar1),0,lVar13 << 2);
  }
  local_1f0 = running_means;
  iVar1 = (*(invstds->super_tensor)._vptr_tensor[4])(invstds);
  lVar13 = (invstds->super_tensor).m_size;
  if (lVar13 != 0) {
    memset((void *)CONCAT44(extraout_var_00,iVar1),0,lVar13 << 2);
  }
  iVar1 = (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  lVar3 = CONCAT44(extraout_var_01,iVar1);
  iVar1 = (*(means->super_tensor)._vptr_tensor[3])(means);
  lVar4 = CONCAT44(extraout_var_02,iVar1);
  iVar1 = (*src->_vptr_tensor[2])(src);
  pfVar5 = (float *)CONCAT44(extraout_var_03,iVar1);
  lVar13 = src->m_n;
  lVar18 = src->m_k * src->m_nr * src->m_nc;
  if (0 < lVar18) {
    lVar11 = 0;
    do {
      pfVar6 = pfVar5;
      lVar16 = lVar13;
      if (0 < lVar13) {
        do {
          fVar20 = *pfVar6;
          *(float *)(lVar4 + lVar11 * 4) = *(float *)(lVar4 + lVar11 * 4) + fVar20;
          *(float *)(lVar3 + lVar11 * 4) = fVar20 * fVar20 + *(float *)(lVar3 + lVar11 * 4);
          pfVar6 = pfVar6 + lVar18;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      lVar11 = lVar11 + 1;
      pfVar5 = pfVar5 + 1;
    } while (lVar11 != lVar18);
  }
  iVar1 = (*(means->super_tensor)._vptr_tensor[3])(means);
  pfVar6 = (float *)CONCAT44(extraout_var_04,iVar1);
  iVar1 = (*(means->super_tensor)._vptr_tensor[3])(means);
  pfVar5 = (float *)(CONCAT44(extraout_var_05,iVar1) + (means->super_tensor).m_size * 4);
  if (pfVar6 != pfVar5) {
    do {
      *pfVar6 = *pfVar6 * (1.0 / (float)lVar13);
      pfVar6 = pfVar6 + 1;
    } while (pfVar6 != pfVar5);
  }
  lVar13 = src->m_n;
  iVar1 = (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  pfVar6 = (float *)CONCAT44(extraout_var_06,iVar1);
  iVar1 = (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  pfVar5 = (float *)(CONCAT44(extraout_var_07,iVar1) + (invstds->super_tensor).m_size * 4);
  if (pfVar6 != pfVar5) {
    do {
      *pfVar6 = *pfVar6 * (1.0 / (float)lVar13);
      pfVar6 = pfVar6 + 1;
    } while (pfVar6 != pfVar5);
  }
  (*(invstds->super_tensor)._vptr_tensor[3])(invstds);
  (*(means->super_tensor)._vptr_tensor[3])();
  lVar13 = (invstds->super_tensor).m_n;
  lVar11 = (invstds->super_tensor).m_k;
  lVar16 = (invstds->super_tensor).m_nr;
  lVar12 = (invstds->super_tensor).m_nc;
  (running_variances->super_tensor).m_n = lVar13;
  (running_variances->super_tensor).m_k = lVar11;
  (running_variances->super_tensor).m_nr = lVar16;
  (running_variances->super_tensor).m_nc = lVar12;
  sVar14 = lVar16 * lVar12 * lVar11 * lVar13;
  (running_variances->super_tensor).m_size = sVar14;
  gpu_data::set_size(&running_variances->data_instance,sVar14);
  iVar1 = (*(running_variances->super_tensor)._vptr_tensor[3])(running_variances);
  if (0 < lVar18) {
    dVar21 = (double)src->m_n / ((double)src->m_n + -1.0);
    lVar13 = 0;
    do {
      fVar20 = *(float *)(lVar4 + lVar13 * 4);
      fVar20 = *(float *)(lVar3 + lVar13 * 4) - fVar20 * fVar20;
      if ((averaging_factor != 1.0) || (NAN(averaging_factor))) {
        dVar22 = dVar21 * averaging_factor * (double)fVar20 +
                 (double)*(float *)(CONCAT44(extraout_var_08,iVar1) + lVar13 * 4) *
                 (1.0 - averaging_factor);
      }
      else {
        dVar22 = dVar21 * (double)fVar20;
      }
      *(float *)(CONCAT44(extraout_var_08,iVar1) + lVar13 * 4) = (float)dVar22;
      dVar22 = (double)fVar20 + eps;
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      *(float *)(lVar3 + lVar13 * 4) = (float)(1.0 / dVar22);
      lVar13 = lVar13 + 1;
    } while (lVar18 - lVar13 != 0);
  }
  iVar1 = (*src->_vptr_tensor[2])();
  lVar11 = CONCAT44(extraout_var_09,iVar1);
  iVar1 = (*(local_1f8->super_tensor)._vptr_tensor[3])();
  lVar16 = CONCAT44(extraout_var_10,iVar1);
  iVar1 = (*local_1e8->_vptr_tensor[2])();
  iVar2 = (*local_1e0->_vptr_tensor[2])();
  this = local_1f0;
  lVar13 = src->m_n;
  if (0 < lVar13) {
    lVar12 = 0;
    do {
      if (0 < lVar18) {
        lVar15 = 0;
        lVar17 = 0;
        do {
          fVar20 = (*(float *)(lVar11 + lVar17 * 4) - *(float *)(lVar4 + lVar17 * 4)) *
                   *(float *)(lVar3 + lVar17 * 4);
          *(float *)(lVar16 + lVar17 * 4) = fVar20;
          *(float *)(lVar16 + lVar17 * 4) =
               fVar20 * *(float *)(CONCAT44(extraout_var_11,iVar1) + lVar17 * 4) +
               *(float *)(CONCAT44(extraout_var_12,iVar2) + lVar17 * 4);
          lVar17 = lVar17 + 1;
          lVar15 = lVar15 + -4;
        } while (lVar18 - lVar17 != 0);
        lVar16 = lVar16 - lVar15;
        lVar11 = lVar11 - lVar15;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar13);
  }
  lVar13 = (means->super_tensor).m_n;
  lVar3 = (means->super_tensor).m_k;
  lVar4 = (means->super_tensor).m_nr;
  lVar18 = (means->super_tensor).m_nc;
  (local_1f0->super_tensor).m_n = lVar13;
  (local_1f0->super_tensor).m_k = lVar3;
  (local_1f0->super_tensor).m_nr = lVar4;
  (local_1f0->super_tensor).m_nc = lVar18;
  sVar14 = lVar4 * lVar18 * lVar3 * lVar13;
  (local_1f0->super_tensor).m_size = sVar14;
  gpu_data::set_size(&local_1f0->data_instance,sVar14);
  if ((averaging_factor == 1.0) && (!NAN(averaging_factor))) {
    resizable_tensor::operator=(this,means);
    return;
  }
  uVar7 = (this->super_tensor).m_size;
  if (uVar7 == 0) {
    local_1c8._0_8_ = (_func_int **)0x0;
    uVar19 = 0;
    uVar7 = 0;
  }
  else {
    uVar19 = (this->super_tensor).m_n;
    uVar7 = uVar7 / uVar19;
    iVar1 = (*(this->super_tensor)._vptr_tensor[2])(this);
    local_1c8._0_8_ = CONCAT44(extraout_var_13,iVar1);
  }
  local_1d8 = (undefined8 *)local_1c8;
  local_1d0 = (float)(1.0 - averaging_factor);
  uVar8 = (means->super_tensor).m_size;
  local_1c8._8_8_ = uVar19;
  local_1c8._16_8_ = uVar7;
  local_1b0 = uVar7;
  if (uVar8 == 0) {
    local_218._M_dataplus._M_p = (pointer)0x0;
    uVar7 = 0;
    uVar8 = 0;
  }
  else {
    uVar7 = (means->super_tensor).m_n;
    uVar8 = uVar8 / uVar7;
    iVar1 = (*(means->super_tensor)._vptr_tensor[2])(means);
    local_218._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_14,iVar1);
  }
  local_50 = &local_218;
  local_48 = (float)averaging_factor;
  local_38 = &local_50;
  local_40 = &local_1d8;
  local_218._M_string_length = uVar7;
  local_218.field_2._M_allocated_capacity = uVar8;
  local_218.field_2._8_8_ = uVar8;
  resizable_tensor::operator=
            (this,(matrix_exp<dlib::matrix_add_exp<dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>,_dlib::matrix_mul_scal_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_true>_>_>
                   *)&local_40);
  return;
}

Assistant:

void batch_normalize (
            const double eps,
            resizable_tensor& dest,
            resizable_tensor& means,
            resizable_tensor& invstds,
            const double averaging_factor,
            resizable_tensor& running_means,
            resizable_tensor& running_variances,
            const tensor& src,
            const tensor& gamma, 
            const tensor& beta 
        )
        {
            DLIB_CASSERT(0 <= averaging_factor && averaging_factor <= 1, "averaging_factor: " << averaging_factor);
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_means,means));
            DLIB_CASSERT(averaging_factor==1 || have_same_dimensions(running_variances,invstds));
            DLIB_CASSERT(
                src.num_samples() > 1 &&
                gamma.num_samples() == 1 && 
                beta.num_samples() == 1 && 
                gamma.nr() == beta.nr() && beta.nr() == src.nr() &&
                gamma.nc() == beta.nc() && beta.nc() == src.nc() &&
                gamma.k()  == beta.k()  && beta.k() == src.k() &&
                eps > 0, 
                "\ngamma.num_samples(): " << gamma.num_samples() << 
                "\ngamma.k():  " << gamma.k() << 
                "\ngamma.nr(): " << gamma.nr() << 
                "\ngamma.nc(): " << gamma.nc() << 
                "\nbeta.num_samples(): " << beta.num_samples() << 
                "\nbeta.k():   " << beta.k() << 
                "\nbeta.nr():  " << beta.nr() << 
                "\nbeta.nc():  " << beta.nc() << 
                "\nsrc.k():   " << src.k() << 
                "\nsrc.nr():  " << src.nr() << 
                "\nsrc.nc():  " << src.nc() <<
                "\neps:  " << eps 
            );

            dest.copy_size(src);
            means.set_size(1, src.k(), src.nr(), src.nc());
            invstds.set_size(1, src.k(), src.nr(), src.nc());

            // first compute means and invstds
            means = 0;
            invstds = 0;
            const auto p_invstds = invstds.host();
            const auto p_means = means.host();
            auto p_src = src.host();
            const long num = src.k()*src.nr()*src.nc();
            // compute means, and sum of squares
            for (long i = 0; i < num; ++i)
            {
                for (long n = 0; n < src.num_samples(); ++n)
                {
                    float val = p_src[n*num+i];
                    p_means[i] += val;
                    p_invstds[i] += val*val;
                }
            }
            means /= src.num_samples();
            invstds /= src.num_samples();
            // copy data back to host
            invstds.host(); means.host();

            // compute variances 
            running_variances.copy_size(invstds);
            auto rvar = running_variances.host();
            // This scale makes the running variances unbiased.
            const double scale = (src.num_samples())/(src.num_samples()-1.0);
            for (long i = 0; i < num; ++i)
            {
                auto actual_var = p_invstds[i] - p_means[i]*p_means[i];
                if (averaging_factor == 1)
                    rvar[i] = scale*actual_var;
                else
                    rvar[i] = (1-averaging_factor)*rvar[i] + scale*averaging_factor*actual_var;

                p_invstds[i] = 1.0f/std::sqrt(actual_var + eps);
            }

            p_src = src.host();
            auto p_dest = dest.host();
            const auto p_gamma = gamma.host();   
            const auto p_beta = beta.host();   
            for (long n = 0; n < src.num_samples(); ++n)
            {
                for (long i = 0; i < num; ++i)
                {
                    *p_dest = (*p_src - p_means[i])*p_invstds[i];
                    *p_dest = (*p_dest)*p_gamma[i] + p_beta[i];
                    ++p_src;
                    ++p_dest;
                }
            }

            // now keep track of the running means 
            running_means.copy_size(means);
            if (averaging_factor != 1)
                running_means = (1-averaging_factor)*mat(running_means) + averaging_factor*mat(means);
            else
                running_means = means;
        }